

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QSize __thiscall QMainWindowLayoutState::minimumSize(QMainWindowLayoutState *this)

{
  long lVar1;
  QSize QVar2;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QSize result;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QToolBarAreaLayout *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSize::QSize((QSize *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QDockAreaLayout::minimumSize(in_RDI);
  QVar2 = QToolBarAreaLayout::minimumSize(in_stack_ffffffffffffffe0,(QSize *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayoutState::minimumSize() const
{
    QSize result(0, 0);

#if QT_CONFIG(dockwidget)
    result = dockAreaLayout.minimumSize();
#else
    if (centralWidgetItem)
        result = centralWidgetItem->minimumSize();
#endif

#if QT_CONFIG(toolbar)
    result = toolBarAreaLayout.minimumSize(result);
#endif // QT_CONFIG(toolbar)

    return result;
}